

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> __thiscall
Parser::parseConcatExpr(Parser *this)

{
  TokenType TVar1;
  pointer pcVar2;
  pointer in_RAX;
  pointer pcVar3;
  pointer *__ptr_1;
  pointer *__ptr;
  Parser *in_RSI;
  _Alloc_hider local_28;
  
  local_28._M_p = in_RAX;
  parseAddExpr(this);
  TVar1 = (in_RSI->m_currToken).type;
  while (TVar1 == Ampersand) {
    eatToken(in_RSI,Ampersand);
    parseAddExpr((Parser *)&stack0xffffffffffffffd8);
    pcVar3 = (pointer)operator_new(0x20);
    pcVar2 = (this->m_lexer).m_input._M_dataplus._M_p;
    *(undefined ***)pcVar3 = &PTR__BinaryExpr_00181a48;
    pcVar3[8] = '\a';
    pcVar3[9] = '\0';
    pcVar3[10] = '\0';
    pcVar3[0xb] = '\0';
    *(pointer *)(pcVar3 + 0x10) = pcVar2;
    *(pointer *)(pcVar3 + 0x18) = local_28._M_p;
    (this->m_lexer).m_input._M_dataplus._M_p = pcVar3;
    TVar1 = (in_RSI->m_currToken).type;
  }
  return (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)
         (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<AST::Expr> Parser::parseConcatExpr() {
    std::unique_ptr<AST::Expr> expr = parseAddExpr();
    while (m_currToken.type == TokenType::Ampersand) {
        TokenType op = m_currToken.type;
        eatToken(m_currToken.type);
        auto right = parseAddExpr();
        expr = std::make_unique<AST::BinaryExpr>(op,
                                                 std::move(expr),
                                                 std::move(right));
    }
    return expr;
}